

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O2

void __thiscall CPlayer::UpdateDeadSpecMode(CPlayer *this)

{
  CGameContext *pCVar1;
  CPlayer *pCVar2;
  bool bVar3;
  long lVar4;
  
  pCVar1 = this->m_pGameServer;
  if ((((long)this->m_SpectatorID != -1) &&
      (pCVar2 = pCVar1->m_apPlayers[this->m_SpectatorID], pCVar2 != (CPlayer *)0x0)) &&
     (bVar3 = DeadCanFollow(this,pCVar2), bVar3)) {
    return;
  }
  lVar4 = 0;
  while( true ) {
    if (lVar4 == 0x40) {
      this->m_DeadSpecMode = false;
      return;
    }
    pCVar2 = pCVar1->m_apPlayers[lVar4];
    if ((pCVar2 != (CPlayer *)0x0) && (bVar3 = DeadCanFollow(this,pCVar2), bVar3)) break;
    lVar4 = lVar4 + 1;
  }
  this->m_SpectatorID = (int)lVar4;
  return;
}

Assistant:

void CPlayer::UpdateDeadSpecMode()
{
	// check if actual spectator id is valid
	if(m_SpectatorID != -1 && GameServer()->m_apPlayers[m_SpectatorID] && DeadCanFollow(GameServer()->m_apPlayers[m_SpectatorID]))
		return;

	// find player to follow
	for(int i = 0; i < MAX_CLIENTS; ++i)
	{
		if(GameServer()->m_apPlayers[i] && DeadCanFollow(GameServer()->m_apPlayers[i]))
		{
			m_SpectatorID = i;
			return;
		}
	}

	// no one available to follow -> turn spectator mode off
	m_DeadSpecMode = false;
}